

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

PyObject * pybind11_meta_call(PyObject *type,PyObject *args,PyObject *kwargs)

{
  ulong uVar1;
  pointer pptVar2;
  undefined8 uVar3;
  byte bVar4;
  bool bVar5;
  PyObject *obj;
  ulong uVar6;
  iterator __begin2;
  values_and_holders vhs;
  allocator<char> local_81;
  iterator local_80;
  long *local_50 [2];
  long local_40 [2];
  values_and_holders local_30;
  
  obj = (PyObject *)(*_PyErr_Format)();
  if (obj == (PyObject *)0x0) {
LAB_00134e70:
    obj = (PyObject *)0x0;
  }
  else {
    pybind11::detail::values_and_holders::values_and_holders(&local_30,obj);
    pybind11::detail::values_and_holders::iterator::iterator(&local_80,local_30.inst,local_30.tinfo)
    ;
    uVar6 = (long)((local_30.tinfo)->
                  super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)((local_30.tinfo)->
                  super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3;
    if (local_80.curr.index != uVar6) {
      do {
        if (((local_80.curr.inst)->field_0x30 & 2) == 0) {
          bVar4 = ((local_80.curr.inst)->field_1).nonsimple.status[local_80.curr.index] & 1;
        }
        else {
          bVar4 = (local_80.curr.inst)->field_0x30 & 4;
        }
        if ((bVar4 == 0) &&
           (bVar5 = pybind11::detail::values_and_holders::is_redundant_value_and_holder
                              (&local_30,&local_80.curr), uVar3 = _PyExc_TypeError, !bVar5)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_50,(local_80.curr.type)->type->tp_name,&local_81);
          PyErr_Format(uVar3,"%.200s.__init__() must be called when overriding __init__",local_50[0]
                      );
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          obj->ob_refcnt = obj->ob_refcnt + -1;
          if (obj->ob_refcnt == 0) {
            _Py_Dealloc(obj);
          }
          goto LAB_00134e70;
        }
        if (((local_80.inst)->field_0x30 & 2) == 0) {
          local_80.curr.vh =
               local_80.curr.vh +
               ((local_80.types)->
               super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
               )._M_impl.super__Vector_impl_data._M_start[local_80.curr.index]->holder_size_in_ptrs
               + 1;
        }
        uVar1 = local_80.curr.index + 1;
        pptVar2 = ((local_80.types)->
                  super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (uVar1 < (ulong)((long)((local_80.types)->
                                  super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pptVar2 >> 3))
        {
          local_80.curr.type = pptVar2[local_80.curr.index + 1];
        }
        else {
          local_80.curr.type = (type_info *)0x0;
        }
        local_80.curr.index = uVar1;
      } while (uVar1 != uVar6);
    }
  }
  return obj;
}

Assistant:

inline PyObject *pybind11_meta_call(PyObject *type, PyObject *args, PyObject *kwargs) {

    // use the default metaclass call to create/initialize the object
    PyObject *self = PyType_Type.tp_call(type, args, kwargs);
    if (self == nullptr) {
        return nullptr;
    }

    // Ensure that the base __init__ function(s) were called
    values_and_holders vhs(self);
    for (const auto &vh : vhs) {
        if (!vh.holder_constructed() && !vhs.is_redundant_value_and_holder(vh)) {
            PyErr_Format(PyExc_TypeError,
                         "%.200s.__init__() must be called when overriding __init__",
                         get_fully_qualified_tp_name(vh.type->type).c_str());
            Py_DECREF(self);
            return nullptr;
        }
    }

    return self;
}